

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bare_fft_interface.c
# Opt level: O2

int dfft_create_1d_plan(plan_t *plan,int dim,int howmany,int istride,int idist,int ostride,int odist
                       ,int dir)

{
  plan->n = dim;
  plan->istride = istride;
  plan->ostride = ostride;
  plan->idist = idist;
  plan->odist = odist;
  plan->howmany = howmany;
  return 0;
}

Assistant:

int dfft_create_1d_plan(
    plan_t *plan,
    int dim,
    int howmany,
    int istride,
    int idist,
    int ostride,
    int odist,
    int dir)
    {
    plan->n = dim;
    plan->istride = istride;
    plan->ostride = ostride;
    plan->idist = idist;
    plan->odist = odist;
    plan->howmany = howmany;
    return 0;
    }